

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O3

string_view __thiscall
libtorrent::bdecode_node::list_string_value_at(bdecode_node *this,int i,string_view default_val)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  string_view sVar6;
  bdecode_node n;
  bdecode_node local_58;
  
  sVar4 = default_val.len_;
  pcVar5 = default_val.ptr_;
  list_at(&local_58,this,i);
  lVar3 = (long)local_58.m_token_idx;
  if (lVar3 != -1) {
    uVar1 = SUB84(local_58.m_root_tokens[lVar3],0);
    if ((uVar1 & 0xe0000000) == 0x60000000) {
      lVar2 = ((ulong)local_58.m_root_tokens[lVar3] >> 0x3d) + (ulong)(uVar1 & 0x1fffffff);
      sVar4 = (size_t)(int)(((*(uint *)(local_58.m_root_tokens + lVar3 + 1) & 0x1fffffff) -
                            (int)lVar2) + -2);
      pcVar5 = local_58.m_buffer + lVar2 + 2;
    }
  }
  if (local_58.m_tokens.
      super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      .
      super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.m_tokens.
                    super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    .
                    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.m_tokens.
                          super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          .
                          super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.m_tokens.
                          super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          .
                          super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  sVar6.len_ = sVar4;
  sVar6.ptr_ = pcVar5;
  return sVar6;
}

Assistant:

string_view bdecode_node::list_string_value_at(int i
		, string_view default_val) const
	{
		bdecode_node const n = list_at(i);
		if (n.type() != bdecode_node::string_t) return default_val;
		return n.string_value();
	}